

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void cvRescale(CVodeMem cv_mem)

{
  long in_RDI;
  int is;
  int j;
  undefined4 local_10;
  undefined4 local_c;
  
  **(undefined8 **)(in_RDI + 0xa50) = *(undefined8 *)(in_RDI + 0x3f8);
  for (local_c = 1; local_c <= *(int *)(in_RDI + 0x3c0); local_c = local_c + 1) {
    *(double *)(*(long *)(in_RDI + 0xa50) + (long)local_c * 8) =
         *(double *)(in_RDI + 0x3f8) *
         *(double *)(*(long *)(in_RDI + 0xa50) + (long)(local_c + -1) * 8);
  }
  N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x3c0),*(undefined8 *)(in_RDI + 0xa50),in_RDI + 0x158
                      ,in_RDI + 0x158);
  if (*(int *)(in_RDI + 0x5c) != 0) {
    N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x3c0),*(undefined8 *)(in_RDI + 0xa50),
                        in_RDI + 0x208,in_RDI + 0x208);
  }
  if ((*(int *)(in_RDI + 0x8c) != 0) || (*(int *)(in_RDI + 0x108) != 0)) {
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x90); local_10 = local_10 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0xa50) + (long)local_10 * 8) =
           *(undefined8 *)(in_RDI + 0x3f8);
    }
    for (local_c = 1; local_c <= *(int *)(in_RDI + 0x3c0); local_c = local_c + 1) {
      for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x90); local_10 = local_10 + 1) {
        *(double *)
         (*(long *)(in_RDI + 0xa50) + (long)(local_c * *(int *)(in_RDI + 0x90) + local_10) * 8) =
             *(double *)(in_RDI + 0x3f8) *
             *(double *)
              (*(long *)(in_RDI + 0xa50) +
              (long)((local_c + -1) * *(int *)(in_RDI + 0x90) + local_10) * 8);
      }
    }
  }
  if (*(int *)(in_RDI + 0x8c) != 0) {
    for (local_c = 1; local_c <= *(int *)(in_RDI + 0x3c0); local_c = local_c + 1) {
      for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x90); local_10 = local_10 + 1) {
        *(undefined8 *)
         (*(long *)(in_RDI + 0xa58) +
         (long)((local_c + -1) * *(int *)(in_RDI + 0x90) + local_10) * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x288 + (long)local_c * 8) + (long)local_10 * 8);
      }
    }
    N_VScaleVectorArray(*(int *)(in_RDI + 0x3c0) * *(int *)(in_RDI + 0x90),
                        *(undefined8 *)(in_RDI + 0xa50),*(undefined8 *)(in_RDI + 0xa58),
                        *(undefined8 *)(in_RDI + 0xa58));
  }
  if (*(int *)(in_RDI + 0x108) != 0) {
    for (local_c = 1; local_c <= *(int *)(in_RDI + 0x3c0); local_c = local_c + 1) {
      for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x90); local_10 = local_10 + 1) {
        *(undefined8 *)
         (*(long *)(in_RDI + 0xa58) +
         (long)((local_c + -1) * *(int *)(in_RDI + 0x90) + local_10) * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 800 + (long)local_c * 8) + (long)local_10 * 8);
      }
    }
    N_VScaleVectorArray(*(int *)(in_RDI + 0x3c0) * *(int *)(in_RDI + 0x90),
                        *(undefined8 *)(in_RDI + 0xa50),*(undefined8 *)(in_RDI + 0xa58),
                        *(undefined8 *)(in_RDI + 0xa58));
  }
  *(double *)(in_RDI + 0x3e0) = *(double *)(in_RDI + 0x400) * *(double *)(in_RDI + 0x3f8);
  *(undefined8 *)(in_RDI + 0x3f0) = *(undefined8 *)(in_RDI + 0x3e0);
  *(undefined8 *)(in_RDI + 0x400) = *(undefined8 *)(in_RDI + 0x3e0);
  *(undefined4 *)(in_RDI + 0x948) = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;
  int is;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  if (cv_mem->cv_quadr)
  {
    (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                              cv_mem->cv_znQ + 1, cv_mem->cv_znQ + 1);
  }

  /* compute sensi scaling factors */
  if (cv_mem->cv_sensi || cv_mem->cv_quadr_sensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_eta;
    }
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[j * cv_mem->cv_Ns + is] =
          cv_mem->cv_eta * cv_mem->cv_cvals[(j - 1) * cv_mem->cv_Ns + is];
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znQS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}